

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# push.c
# Opt level: O0

void push0_recv_cb(void *arg)

{
  nng_err nVar1;
  nni_msg *m;
  push0_pipe *p;
  void *arg_local;
  
  nVar1 = nni_aio_result((nni_aio *)((long)arg + 0x20));
  if (nVar1 == NNG_OK) {
    m = nni_aio_get_msg((nni_aio *)((long)arg + 0x20));
    nni_msg_free(m);
    nni_aio_set_msg((nni_aio *)((long)arg + 0x20),(nni_msg *)0x0);
    nni_pipe_recv(*arg,(nni_aio *)((long)arg + 0x20));
  }
  else {
    nni_pipe_close(*arg);
  }
  return;
}

Assistant:

static void
push0_recv_cb(void *arg)
{
	push0_pipe *p = arg;

	// We normally expect to receive an error.  If a pipe actually
	// sends us data, we just discard it.
	if (nni_aio_result(&p->aio_recv) != 0) {
		nni_pipe_close(p->pipe);
		return;
	}
	nni_msg_free(nni_aio_get_msg(&p->aio_recv));
	nni_aio_set_msg(&p->aio_recv, NULL);
	nni_pipe_recv(p->pipe, &p->aio_recv);
}